

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O0

string * camel_case_to_underscore(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  char x;
  size_t end;
  size_t i;
  string *s_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  end = 0;
  uVar2 = std::__cxx11::string::size();
  for (; end < uVar2; end = end + 1) {
    pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)s);
    bVar1 = *pbVar3;
    if (((char)bVar1 < 'A') || ('Z' < (char)bVar1)) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar1);
    }
    else {
      if (end != 0) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,bVar1 | 0x20);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string camel_case_to_underscore(const std::string &s) {
  std::string ret;
  for (size_t i = 0, end = s.size(); i < end; i++) {
    char x = s[i];
    if (x >= 'A' && x <= 'Z') {
      if (i != 0) {
        ret += '_';
      }
      ret += (char)(x | 32);
    } else {
      ret += x;
    }
  }
  return ret;
}